

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

void __thiscall LSL_STDZ<TTA>::Dealloc(LSL_STDZ<TTA> *this)

{
  Table2D::Release(&this->ERA);
  if (this->ner != (int *)0x0) {
    operator_delete__(this->ner);
  }
  Table2D::Release(&this->RLC);
  Table2D::Release(&this->ER);
  TTA::Dealloc();
  return;
}

Assistant:

void Dealloc() {
        ERA.Release();

        delete[] ner;
        RLC.Release();
        ER.Release();

        // No free for img_labels_ because it is required at the end of the algorithm 
        LabelsSolver::Dealloc();
    }